

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

int unpack_init(WavpackContext *wpc)

{
  uint32_t uVar1;
  uint uVar2;
  long lVar3;
  words_data *pwVar4;
  entropy_data *peVar5;
  int iVar6;
  long in_FS_OFFSET;
  WavpackMetadata wpmd;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (((wpc->stream).wphdr.block_samples != 0) &&
     (uVar1 = (wpc->stream).wphdr.block_index, uVar1 != 0xffffffff)) {
    (wpc->stream).sample_index = uVar1;
  }
  (wpc->stream).mute_error = 0;
  (wpc->stream).crc = 0xffffffff;
  (wpc->stream).wvbits.buf = (uchar *)0x0;
  (wpc->stream).wvbits.end = (uchar *)0x0;
  (wpc->stream).wvbits.ptr = (uchar *)0x0;
  (wpc->stream).wvbits.wrap = (_func_void_bs_ptr *)0x0;
  (wpc->stream).wvbits.file_bytes = 0;
  (wpc->stream).wvbits.sr = 0;
  (wpc->stream).wvbits.error = 0;
  (wpc->stream).wvbits.bc = 0;
  (wpc->stream).wvbits.file = (read_stream)0x0;
  memset((wpc->stream).decorr_passes,0,0x480);
  (wpc->stream).w.bitrate_delta[0] = 0;
  (wpc->stream).w.bitrate_delta[1] = 0;
  (wpc->stream).w.bitrate_acc[0] = 0;
  (wpc->stream).w.bitrate_acc[1] = 0;
  (wpc->stream).w.pend_data = 0;
  (wpc->stream).w.holding_one = 0;
  (wpc->stream).w.zeros_acc = 0;
  (wpc->stream).w.holding_zero = 0;
  (wpc->stream).w.pend_count = 0;
  (wpc->stream).w.c[0].median[0] = 0;
  pwVar4 = &(wpc->stream).w;
  pwVar4->c[0].median[1] = 0;
  pwVar4->c[0].median[2] = 0;
  (wpc->stream).w.c[0].slow_level = 0;
  (wpc->stream).w.c[0].error_limit = 0;
  pwVar4 = &(wpc->stream).w;
  pwVar4->c[1].median[0] = 0;
  pwVar4->c[1].median[1] = 0;
  peVar5 = (wpc->stream).w.c;
  peVar5[1].median[1] = 0;
  peVar5[1].median[2] = 0;
  (wpc->stream).w.c[1].slow_level = 0;
  (wpc->stream).w.c[1].error_limit = 0;
  do {
    iVar6 = read_metadata_buff(wpc,&wpmd);
    if (iVar6 == 0) break;
    iVar6 = process_metadata(wpc,&wpmd);
    if (iVar6 == 0) {
      builtin_strncpy(wpc->error_message,"invalid metadata!",0x12);
      goto LAB_0019f1fb;
    }
  } while (wpmd.id != '\n');
  iVar6 = 1;
  if ((wpc->stream).wphdr.block_samples != 0) {
    if ((wpc->stream).wvbits.ptr == (uchar *)0x0) {
      builtin_strncpy(wpc->error_message,"invalid WavPack file!",0x16);
LAB_0019f1fb:
      iVar6 = 0;
    }
    else {
      uVar2 = (wpc->stream).wphdr.flags;
      if (((uVar2 >> 8 & 1) != 0) && ((wpc->stream).int32_sent_bits != '\0')) {
        wpc->lossy_blocks = 1;
      }
      if (((char)uVar2 < '\0') && (((wpc->stream).float_flags & 0x2e) != 0)) {
        wpc->lossy_blocks = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int unpack_init (WavpackContext *wpc)
{
    WavpackStream *wps = &wpc->stream;
    WavpackMetadata wpmd;

    if (wps->wphdr.block_samples && wps->wphdr.block_index != (uint32_t) -1)
        wps->sample_index = wps->wphdr.block_index;

    wps->mute_error = FALSE;
    wps->crc = 0xffffffff;
    CLEAR (wps->wvbits);
    CLEAR (wps->decorr_passes);
    CLEAR (wps->w);

    while (read_metadata_buff (wpc, &wpmd)) {
        if (!process_metadata (wpc, &wpmd)) {
            strcpy (wpc->error_message, "invalid metadata!");
            return FALSE;
        }

        if (wpmd.id == ID_WV_BITSTREAM)
            break;
    }

    if (wps->wphdr.block_samples && !bs_is_open (&wps->wvbits)) {
        strcpy (wpc->error_message, "invalid WavPack file!");
        return FALSE;
    }

    if (wps->wphdr.block_samples) {
        if ((wps->wphdr.flags & INT32_DATA) && wps->int32_sent_bits)
            wpc->lossy_blocks = TRUE;

        if ((wps->wphdr.flags & FLOAT_DATA) &&
            wps->float_flags & (FLOAT_EXCEPTIONS | FLOAT_ZEROS_SENT | FLOAT_SHIFT_SENT | FLOAT_SHIFT_SAME))
                wpc->lossy_blocks = TRUE;
    }

    return TRUE;
}